

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

void __thiscall
kratos::InterfaceModPortDefinition::InterfaceModPortDefinition
          (InterfaceModPortDefinition *this,shared_ptr<kratos::InterfaceDefinition> *def,
          string *name)

{
  string *name_local;
  shared_ptr<kratos::InterfaceDefinition> *def_local;
  InterfaceModPortDefinition *this_local;
  
  IDefinition::IDefinition(&this->super_IDefinition);
  (this->super_IDefinition)._vptr_IDefinition = (_func_int **)&PTR_has_port_005a64d8;
  std::shared_ptr<kratos::InterfaceDefinition>::shared_ptr(&this->def_,def);
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->inputs_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->outputs_);
  return;
}

Assistant:

InterfaceModPortDefinition::InterfaceModPortDefinition(
    std::shared_ptr<kratos::InterfaceDefinition> def, std::string name)
    : def_(std::move(def)), name_(std::move(name)) {}